

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ObjectivePropagation::recomputeCapacityThreshold(ObjectivePropagation *this)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  HighsDomain *pHVar4;
  HighsObjectiveFunction *pHVar5;
  pointer piVar6;
  HighsMipSolver *pHVar7;
  pointer pOVar8;
  pointer ppVar9;
  pointer piVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pHVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  pHVar4 = this->domain;
  pHVar5 = this->objFunc;
  piVar6 = (pHVar5->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = (int)((ulong)((long)(pHVar5->cliquePartitionStart).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar6) >> 2) - 1;
  pHVar7 = pHVar4->mipsolver;
  dVar2 = ((pHVar7->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
  dVar19 = -dVar2;
  this->capacityThreshold = dVar19;
  if (0 < (int)uVar16) {
    pOVar8 = (this->objectiveLowerContributions).
             super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = (this->contributionPartitionSets).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    do {
      iVar3 = ppVar9[uVar14].second;
      lVar18 = (long)iVar3;
      if (lVar18 != -1) {
        dVar20 = (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[pOVar8[lVar18].col];
        pdVar1 = (pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + pOVar8[lVar18].col;
        if ((dVar20 != *pdVar1) || (NAN(dVar20) || NAN(*pdVar1))) {
          iVar17 = ppVar9[uVar14].first;
          if (iVar17 == -1) {
            iVar15 = -1;
          }
          else {
            do {
              iVar15 = iVar17;
              iVar17 = pOVar8[iVar15].links.child[1];
            } while (iVar17 != -1);
          }
          dVar20 = pOVar8[lVar18].contribution;
          if (iVar15 != iVar3) {
            dVar20 = dVar20 - pOVar8[iVar15].contribution;
          }
          dVar20 = dVar20 * (1.0 - dVar2);
          if (dVar20 <= dVar19) {
            dVar20 = dVar19;
          }
          dVar19 = dVar20;
          this->capacityThreshold = dVar19;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar16);
  }
  piVar10 = (pHVar5->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = piVar6[(int)uVar16];
  lVar18 = (long)iVar3;
  iVar17 = (int)((ulong)((long)(pHVar5->objectiveNonzeros).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar10) >> 2);
  if (iVar3 < iVar17) {
    pdVar11 = (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pHVar13 = (pHVar7->model_->integrality_).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar3 = piVar10[lVar18];
      dVar21 = pdVar12[iVar3] - pdVar11[iVar3];
      dVar20 = dVar2;
      if ((pHVar13[iVar3] == kContinuous) &&
         (dVar22 = dVar21 * 0.3, dVar20 = dVar2 * 1000.0, dVar2 * 1000.0 <= dVar22)) {
        dVar20 = dVar22;
      }
      dVar20 = (dVar21 - dVar20) * ABS(this->cost[iVar3]);
      if (dVar20 <= dVar19) {
        dVar20 = dVar19;
      }
      dVar19 = dVar20;
      this->capacityThreshold = dVar19;
      lVar18 = lVar18 + 1;
    } while (iVar17 != lVar18);
  }
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::recomputeCapacityThreshold() {
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();
  HighsInt numPartitions = objFunc->getNumCliquePartitions();

  capacityThreshold = -domain->feastol();
  for (HighsInt i = 0; i < numPartitions; ++i) {
    ObjectiveContributionTree contributionTree(this, i);
    HighsInt worstPos = contributionTree.first();
    if (worstPos == -1) continue;
    if (domain->isFixed(objectiveLowerContributions[worstPos].col)) continue;

    double contribution = objectiveLowerContributions[worstPos].contribution;
    HighsInt bestPos = contributionTree.last();
    if (bestPos != worstPos)
      contribution -= objectiveLowerContributions[bestPos].contribution;

    capacityThreshold =
        std::max(capacityThreshold, contribution * (1.0 - domain->feastol()));
  }

  const auto& objNonzeros = objFunc->getObjectiveNonzeros();
  const HighsInt numObjNzs = objNonzeros.size();
  for (HighsInt i = partitionStarts[numPartitions]; i < numObjNzs; ++i) {
    HighsInt col = objNonzeros[i];

    capacityThreshold = std::max(
        capacityThreshold,
        std::fabs(cost[col]) *
            boundRange(domain->col_upper_[col], domain->col_lower_[col],
                       domain->feastol(), domain->variableType(col)));
  }
}